

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_ledger.cpp
# Opt level: O0

int CfdFinalizeTxSerializeHashForLedger
              (void *handle,void *serialize_handle,int net_type,char *tx_hex_string,
              bool skip_witness,bool is_authorization,bool is_sha256,char **serialize_hex)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  char *pcVar3;
  char *in_RCX;
  long in_RSI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  undefined8 *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  ByteData256 hashed_data;
  LedgerApi api;
  ConfidentialTransactionContext tx;
  bool is_bitcoin;
  ByteData serialize_data;
  CfdCapiLedgerMetaData *buffer;
  int result;
  string *in_stack_fffffffffffffc98;
  ConfidentialTransactionContext *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffcb8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffcc0;
  bool *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  int network_type;
  string local_2c0;
  ByteData local_2a0;
  ByteData256 local_288 [2];
  string *in_stack_fffffffffffffda8;
  void *in_stack_fffffffffffffdb0;
  allocator local_171;
  string local_170 [39];
  byte local_149;
  ByteData local_148;
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  CfdSourceLocation local_108;
  long local_f0;
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [32];
  CfdSourceLocation local_c0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  allocator local_61;
  string local_60 [48];
  undefined4 local_30;
  byte local_2b;
  byte local_2a;
  byte local_29;
  char *local_28;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
  local_29 = in_R8B & 1;
  local_2a = in_R9B & 1;
  local_2b = in_stack_00000008 & 1;
  local_30 = 0xffffffff;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"LedgerMetaData",&local_61);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = cfd::capi::IsEmptyString(local_28);
  network_type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd04);
  if (bVar1) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_ledger.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0xcd;
    local_80.funcname = "CfdFinalizeTxSerializeHashForLedger";
    cfd::core::logger::warn<>(&local_80,"tx is null or empty.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. tx is null or empty.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffcc0,error_code,in_stack_fffffffffffffcb0);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000010 == (undefined8 *)0x0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_ledger.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0xd3;
    local_c0.funcname = "CfdFinalizeTxSerializeHashForLedger";
    cfd::core::logger::warn<>(&local_c0,"serialize output is null.");
    local_e2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_e0,"Failed to parameter. serialize output is null.",&local_e1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffcc0,error_code,in_stack_fffffffffffffcb0);
    local_e2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_f0 = local_18;
  if (*(long *)(local_18 + 0x10) == 0) {
    local_108.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_ledger.cpp"
                 ,0x2f);
    local_108.filename = local_108.filename + 1;
    local_108.line = 0xdc;
    local_108.funcname = "CfdFinalizeTxSerializeHashForLedger";
    cfd::core::logger::warn<>(&local_108,"buffer state is illegal.");
    local_12a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_128,"Failed to parameter. buffer state is illegal.",&local_129);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffcc0,error_code,in_stack_fffffffffffffcb0);
    local_12a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ByteData::ByteData(&local_148);
  local_149 = 0;
  cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffffcf8);
  if ((local_149 & 1) != 0) {
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"Bitcoin serialize not implement.",&local_171);
    cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffcb0);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar4 = (allocator *)&stack0xfffffffffffffdaf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffdb0,local_28,paVar4);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdaf);
  cfd::api::LedgerApi::LedgerApi((LedgerApi *)&stack0xfffffffffffffdae);
  cfd::api::LedgerApi::Serialize
            ((LedgerApi *)
             tx.verify_ignore_map_.
             super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (ConfidentialTransactionContext *)
             tx.verify_ignore_map_.
             super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
              *)tx.verify_ignore_map_.
                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
                _M_impl.super__Vector_impl_data._M_start,
             tx.verify_map_.
             super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_,
             tx.verify_map_.
             super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._6_1_);
  cfd::core::ByteData::operator=
            ((ByteData *)in_stack_fffffffffffffca0,(ByteData *)in_stack_fffffffffffffc98);
  cfd::core::ByteData::~ByteData((ByteData *)0x5e5656);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffffca0);
  if ((local_2b & 1) != 0) {
    cfd::core::HashUtil::Sha256(local_288,&local_148);
    cfd::core::ByteData256::GetData(&local_2a0,local_288);
    cfd::core::ByteData::operator=
              ((ByteData *)in_stack_fffffffffffffca0,(ByteData *)in_stack_fffffffffffffc98);
    cfd::core::ByteData::~ByteData((ByteData *)0x5e5732);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5e573f);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2c0,&local_148);
  pcVar3 = cfd::capi::CreateString((string *)CONCAT44(network_type,in_stack_fffffffffffffd00));
  *in_stack_00000010 = pcVar3;
  std::__cxx11::string::~string((string *)&local_2c0);
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x5e57c7);
  return local_4;
}

Assistant:

int CfdFinalizeTxSerializeHashForLedger(
    void* handle, void* serialize_handle, int net_type,
    const char* tx_hex_string, bool skip_witness, bool is_authorization,
    bool is_sha256, char** serialize_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(serialize_handle, kPrefixLedgerMetaData);

    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (serialize_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "serialize output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. serialize output is null.");
    }

    CfdCapiLedgerMetaData* buffer =
        static_cast<CfdCapiLedgerMetaData*>(serialize_handle);
    if (buffer->metadata_stack == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }

    ByteData serialize_data;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Bitcoin serialize not implement.");
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      LedgerApi api;
      serialize_data = api.Serialize(
          tx, *(buffer->metadata_stack), skip_witness, is_authorization);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (is_sha256) {
      ByteData256 hashed_data = HashUtil::Sha256(serialize_data);
      serialize_data = hashed_data.GetData();
    }
    *serialize_hex = CreateString(serialize_data.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}